

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.h
# Opt level: O0

uint64_t __thiscall
RandomMixin<FastRandomContext>::randbits<31>(RandomMixin<FastRandomContext> *this)

{
  long lVar1;
  uint64_t uVar2;
  ulong *in_RDI;
  long in_FS_OFFSET;
  uint64_t MASK;
  uint64_t gen;
  uint64_t ret;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffffc8;
  FastRandomContext *in_stack_ffffffffffffffe0;
  uint local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((int)in_RDI[1] < 0x1f) {
    Impl(in_stack_ffffffffffffffc8);
    uVar2 = FastRandomContext::rand64(in_stack_ffffffffffffffe0);
    local_18 = (uint)(uVar2 << ((byte)(int)in_RDI[1] & 0x3f)) | (uint)*in_RDI;
    *in_RDI = uVar2 >> (0x1fU - (char)(int)in_RDI[1] & 0x3f);
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + 0x21;
  }
  else {
    local_18 = (uint)*in_RDI;
    *in_RDI = *in_RDI >> 0x1f;
    *(int *)(in_RDI + 1) = (int)in_RDI[1] + -0x1f;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (ulong)(local_18 & 0x7fffffff);
  }
  __stack_chk_fail();
}

Assistant:

uint64_t randbits() noexcept
    {
        static_assert(Bits >= 0 && Bits <= 64);
        if constexpr (Bits == 64) {
            return Impl().rand64();
        } else {
            uint64_t ret;
            if (Bits <= bitbuf_size) {
                ret = bitbuf;
                bitbuf >>= Bits;
                bitbuf_size -= Bits;
            } else {
                uint64_t gen = Impl().rand64();
                ret = (gen << bitbuf_size) | bitbuf;
                bitbuf = gen >> (Bits - bitbuf_size);
                bitbuf_size = 64 + bitbuf_size - Bits;
            }
            constexpr uint64_t MASK = (uint64_t{1} << Bits) - 1;
            return ret & MASK;
        }
    }